

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_uint.h
# Opt level: O2

bool __thiscall
jbcoin::base_uint<128UL,_void>::SetHex(base_uint<128UL,_void> *this,char *psz,bool bStrict)

{
  uchar uVar1;
  uchar *puVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  undefined7 in_register_00000011;
  uchar *puVar6;
  long lVar7;
  uchar *puVar8;
  undefined1 *puVar9;
  
  if ((int)CONCAT71(in_register_00000011,bStrict) == 0) {
    psz = psz + -1;
    do {
      puVar6 = (uchar *)psz;
      uVar1 = puVar6[1];
      psz = (char *)(puVar6 + 1);
      iVar4 = isspace((int)(char)uVar1);
    } while (iVar4 != 0);
    if (uVar1 == '0') {
      iVar4 = tolower((int)(char)puVar6[2]);
      psz = (char *)((uchar *)psz + (ulong)(iVar4 == 0x78) * 2);
    }
  }
  lVar3 = 0;
  do {
    lVar7 = lVar3;
    iVar4 = charUnHex(((uchar *)psz)[lVar7]);
    lVar3 = lVar7 + 1;
  } while (iVar4 != -1);
  puVar6 = (uchar *)psz + lVar7 + -0x20;
  if ((uint)lVar7 < 0x21) {
    puVar6 = (uchar *)psz;
  }
  puVar9 = (undefined1 *)
           ((long)this[1].pn + (long)((uchar *)psz + ((lVar7 + 1) - (long)puVar6)) / -2);
  this->pn[0] = 0;
  this->pn[1] = 0;
  this->pn[2] = 0;
  this->pn[3] = 0;
  puVar8 = (uchar *)psz + lVar7;
  if (((int)((uchar *)psz + ((lVar7 + 1) - (long)puVar6)) - 1U & 1) == 0) goto LAB_00203e42;
  uVar1 = *puVar6;
  puVar6 = puVar6 + 1;
  uVar5 = charUnHex(uVar1);
  while( true ) {
    *puVar9 = (char)uVar5;
    puVar9 = puVar9 + 1;
LAB_00203e42:
    if (puVar8 == puVar6) {
      return *puVar8 == '\0';
    }
    iVar4 = charUnHex(*puVar6);
    uVar5 = 0;
    puVar2 = puVar6 + 1;
    if (puVar8 != puVar6 + 1) {
      uVar5 = charUnHex(puVar6[1]);
      puVar2 = puVar6 + 2;
    }
    puVar6 = puVar2;
    if (iVar4 == -1) break;
    if (uVar5 == 0xffffffff) {
      return false;
    }
    uVar5 = uVar5 | iVar4 << 4;
  }
  return false;
}

Assistant:

bool SetHex (const char* psz, bool bStrict = false)
    {
        // skip leading spaces
        if (!bStrict)
            while (isspace (*psz))
                psz++;

        // skip 0x
        if (!bStrict && psz[0] == '0' && tolower (psz[1]) == 'x')
            psz += 2;

        const unsigned char* pEnd   = reinterpret_cast<const unsigned char*> (psz);
        const unsigned char* pBegin = pEnd;

        // Find end.
        while (charUnHex(*pEnd) != -1)
            pEnd++;

        // Take only last digits of over long string.
        if ((unsigned int) (pEnd - pBegin) > 2 * size ())
            pBegin = pEnd - 2 * size ();

        unsigned char* pOut = end () - ((pEnd - pBegin + 1) / 2);

        *this = beast::zero;

        if ((pEnd - pBegin) & 1)
            *pOut++ = charUnHex(*pBegin++);

        while (pBegin != pEnd)
        {
            auto cHigh = charUnHex(*pBegin++);
            auto cLow  = pBegin == pEnd
                            ? 0
                            : charUnHex(*pBegin++);

            if (cHigh == -1 || cLow == -1)
                return false;

            *pOut++ = (cHigh << 4) | cLow;
        }

        return !*pEnd;
    }